

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool IsValidEdgeFaceLink(ON_SubDEdge *edge,ON_SubDFace *face,uint edge_face_index,
                        uint face_edge_index,bool bSilentError)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ON_SubDEdgePtr *pOVar9;
  ON_SubDEdge *pOVar10;
  ON_SubDFacePtr *pOVar11;
  ulong uVar5;
  
  if (((((edge != (ON_SubDEdge *)0x0 && face != (ON_SubDFace *)0x0) &&
        ((edge->super_ON_SubDComponentBase).m_level == (face->super_ON_SubDComponentBase).m_level))
       && (uVar1 = edge->m_face_count, uVar1 != 0)) &&
      ((uVar1 < 3 || (edge->m_facex != (ON_SubDFacePtr *)0x0)))) &&
     (edge_face_index == 0xffffffff || edge_face_index < uVar1)) {
    uVar2 = face->m_edge_count;
    uVar5 = (ulong)uVar2;
    if (((uVar2 != 0) && ((uVar2 < 5 || (face->m_edgex != (ON_SubDEdgePtr *)0x0)))) &&
       (face_edge_index == 0xffffffff || face_edge_index < uVar2)) {
      lVar7 = -0x10;
      uVar8 = 0;
      do {
        if (uVar8 < 2) {
          pOVar11 = edge->m_face2 + uVar8;
        }
        else {
          pOVar11 = (ON_SubDFacePtr *)((long)&edge->m_facex->m_ptr + lVar7);
        }
        if ((ON_SubDFace *)(pOVar11->m_ptr & 0xfffffffffffffff8) == face) {
          if (edge_face_index == 0xffffffff) {
            edge_face_index = (uint)uVar8;
          }
          else if (uVar8 != edge_face_index) goto LAB_005cefe3;
        }
        else if (uVar8 == edge_face_index) goto LAB_005cefe3;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 8;
      } while ((uint)uVar1 != uVar8);
      lVar7 = -0x20;
      uVar8 = 0;
      bVar3 = false;
      do {
        if (uVar8 < 4) {
          pOVar9 = face->m_edge4 + uVar8;
LAB_005cf08b:
          pOVar10 = (ON_SubDEdge *)(pOVar9->m_ptr & 0xfffffffffffffff8);
        }
        else {
          if (uVar8 < uVar5) {
            pOVar9 = (ON_SubDEdgePtr *)((long)&face->m_edgex->m_ptr + lVar7);
            goto LAB_005cf08b;
          }
          pOVar10 = (ON_SubDEdge *)0x0;
        }
        if (pOVar10 == edge) {
          if (face_edge_index == 0xffffffff) {
            face_edge_index = (uint)uVar8;
          }
          else if (uVar8 != face_edge_index) goto LAB_005cf0d0;
        }
        else if (uVar8 == face_edge_index) {
LAB_005cf0d0:
          ON_SubDIncrementErrorCount();
          if (bSilentError) {
            uVar5 = 0;
          }
          else {
            bVar4 = ON_IsNotValid();
            uVar5 = (ulong)bVar4;
          }
          goto LAB_005cf0e2;
        }
        uVar8 = uVar8 + 1;
        bVar3 = uVar5 <= uVar8;
        lVar7 = lVar7 + 8;
      } while ((uint)uVar2 != uVar8);
      bVar3 = true;
LAB_005cf0e2:
      bVar6 = bVar3 | (byte)uVar5;
      goto LAB_005cefee;
    }
  }
LAB_005cefe3:
  ON_SubDIncrementErrorCount();
  if (!bSilentError) {
    bVar3 = ON_IsNotValid();
    return bVar3;
  }
  bVar6 = 0;
LAB_005cefee:
  return (bool)(bVar6 & 1);
}

Assistant:

static bool IsValidEdgeFaceLink(
  const ON_SubDEdge* edge,
  const ON_SubDFace* face,
  unsigned int edge_face_index,
  unsigned int face_edge_index,
  bool bSilentError
  )
{
  if (nullptr == edge || nullptr == face)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != face->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int edge_face_count = edge->m_face_count;
  if (edge_face_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (edge_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  if (edge_face_index >= edge_face_count && ON_UNSET_UINT_INDEX != edge_face_index)
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int face_edge_count = face->m_edge_count;
  if (face_edge_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (face_edge_count > 4 && nullptr == face->m_edgex)
    return ON_SubDIsNotValid(bSilentError);

  if (face_edge_index >= face_edge_count && ON_UNSET_UINT_INDEX != face_edge_index)
    return ON_SubDIsNotValid(bSilentError);

  for (unsigned int i = 0; i < edge_face_count; i++)
  {
    if (face == edge->Face(i))
    {
      if (ON_UNSET_UINT_INDEX == edge_face_index)
        edge_face_index = i;
      else if (i != edge_face_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == edge_face_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  for (unsigned int i = 0; i < face_edge_count; i++)
  {
    if (edge == face->Edge(i))
    {
      if (ON_UNSET_UINT_INDEX == face_edge_index)
        face_edge_index = i;
      else if (i != face_edge_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == face_edge_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  return true;
}